

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O2

int8_t __thiscall
icu_63::UnicodeString::caseCompare(UnicodeString *this,UnicodeString *text,uint32_t options)

{
  short sVar1;
  int8_t iVar2;
  int32_t thisLength;
  int32_t srcLength;
  
  sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    thisLength = (this->fUnion).fFields.fLength;
  }
  else {
    thisLength = (int)sVar1 >> 5;
  }
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    srcLength = (text->fUnion).fFields.fLength;
  }
  else {
    srcLength = (int)sVar1 >> 5;
  }
  iVar2 = doCaseCompare(this,0,thisLength,text,0,srcLength,options);
  return iVar2;
}

Assistant:

inline int8_t
UnicodeString::caseCompare(const UnicodeString &text, uint32_t options) const {
  return doCaseCompare(0, length(), text, 0, text.length(), options);
}